

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphs.cpp
# Opt level: O3

void __thiscall Graph::graphCompress(Graph *this,Graph *dest,int n)

{
  pointer pNVar1;
  pointer psVar2;
  pointer pcVar3;
  _Alloc_hider _Var4;
  _Rb_tree_node_base *p_Var5;
  iterator iVar6;
  pointer pNVar7;
  pointer pNVar8;
  ulong uVar9;
  _Rb_tree_header *p_Var10;
  long lVar11;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> e;
  string label;
  string r;
  string l;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nodeSet;
  undefined1 local_170 [8];
  char *local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  int local_150;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  Graph *local_130;
  undefined1 *local_128;
  long local_120;
  undefined1 local_118 [16];
  undefined1 *local_108;
  long local_100;
  undefined1 local_f8 [16];
  undefined1 *local_e8;
  long local_e0;
  undefined1 local_d8 [16];
  ulong local_c8;
  string local_c0;
  string local_a0;
  string local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  local_130 = dest;
  (*dest->_vptr_Graph[1])(dest);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < n) {
    local_c8 = (ulong)(uint)n;
    uVar9 = 0;
    do {
      pNVar1 = (this->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (((long)(int)((ulong)((long)(this->nodes).super__Vector_base<Node,_std::allocator<Node>_>.
                                     _M_impl.super__Vector_impl_data._M_finish - (long)pNVar1) >> 6)
           <= (long)uVar9) || (local_c8 <= local_60._M_impl.super__Rb_tree_header._M_node_count))
      break;
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&local_60,&pNVar1[uVar9].id);
      psVar2 = (this->edges).
               super__Vector_base<std::set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (p_Var5 = psVar2[uVar9]._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var5 != &psVar2[uVar9]._M_t._M_impl.super__Rb_tree_header;
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
        local_170._4_4_ = (undefined4)((ulong)local_170 >> 0x20);
        local_170._0_4_ = p_Var5[1]._M_color;
        local_168 = local_160._M_local_buf + 8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_168,p_Var5[1]._M_parent,
                   (long)&(p_Var5[1]._M_left)->_M_color + (long)p_Var5[1]._M_parent);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&local_60,
                   &(this->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                    super__Vector_impl_data._M_start[(int)local_170._0_4_].id);
        if (local_168 != local_160._M_local_buf + 8) {
          operator_delete(local_168);
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != local_c8);
  }
  pNVar7 = (this->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
           super__Vector_impl_data._M_start;
  pNVar1 = (this->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pNVar8 = pNVar7;
  if (pNVar7 != pNVar1) {
    do {
      pcVar3 = (pNVar7->id)._M_dataplus._M_p;
      local_170 = (undefined1  [8])&local_160;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_170,pcVar3,pcVar3 + (pNVar7->id)._M_string_length);
      local_150 = pNVar7->num;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_148,&pNVar7->labels);
      iVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&local_60,(key_type *)local_170);
      if ((_Rb_tree_header *)iVar6._M_node != &local_60._M_impl.super__Rb_tree_header) {
        insertNode(local_130,(Node *)local_170);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_148);
      if (local_170 != (undefined1  [8])&local_160) {
        operator_delete((void *)local_170);
      }
      pNVar7 = pNVar7 + 1;
    } while (pNVar7 != pNVar1);
    pNVar7 = (this->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pNVar8 = (this->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  if (0 < (int)((ulong)((long)pNVar7 - (long)pNVar8) >> 6)) {
    lVar11 = 0;
    do {
      psVar2 = (this->edges).
               super__Vector_base<std::set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      p_Var10 = &psVar2[lVar11]._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = psVar2[lVar11]._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((_Rb_tree_header *)p_Var5 != p_Var10) {
        do {
          local_170._0_4_ = p_Var5[1]._M_color;
          local_168 = local_160._M_local_buf + 8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_168,p_Var5[1]._M_parent,
                     (long)&(p_Var5[1]._M_left)->_M_color + (long)p_Var5[1]._M_parent);
          pNVar1 = (this->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_e8 = local_d8;
          _Var4._M_p = pNVar1[lVar11].id._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_e8,_Var4._M_p,_Var4._M_p + pNVar1[lVar11].id._M_string_length)
          ;
          pNVar1 = (this->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_108 = local_f8;
          _Var4._M_p = pNVar1[(int)local_170._0_4_].id._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_108,_Var4._M_p,
                     _Var4._M_p + pNVar1[(int)local_170._0_4_].id._M_string_length);
          local_128 = local_118;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_128,local_168,local_168 + local_160._M_allocated_capacity);
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_80,local_e8,local_e8 + local_e0);
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_c0,local_108,local_108 + local_100);
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_a0,local_128,local_128 + local_120);
          insertEdge(local_130,&local_80,&local_c0,&local_a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p);
          }
          if (local_128 != local_118) {
            operator_delete(local_128);
          }
          if (local_108 != local_f8) {
            operator_delete(local_108);
          }
          if (local_e8 != local_d8) {
            operator_delete(local_e8);
          }
          if (local_168 != local_160._M_local_buf + 8) {
            operator_delete(local_168);
          }
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
        } while ((_Rb_tree_header *)p_Var5 != p_Var10);
        pNVar8 = (this->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pNVar7 = (this->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < (int)((ulong)((long)pNVar7 - (long)pNVar8) >> 6));
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void Graph::graphCompress(Graph &dest, int n) {
    dest.clear();

    set<string> nodeSet;

    for (int i = 0; i < n && i < this->nodeNum() && nodeSet.size() < n; i++) {
        nodeSet.insert(this->nodes[i].id);
        for (pair<int, string> e : this->edges[i]) {
            nodeSet.insert(this->nodes[e.first].id);
        }
    }

    for (Node i : this->nodes) {
        if (nodeSet.find(i.id) != nodeSet.end())
            dest.insertNode(i);
    }

    for (int i = 0; i < this->nodeNum(); i++) {
        for (pair<int, string> e : this->edges[i]) {
            string l = this->nodes[i].id;
            string r = this->nodes[e.first].id;
            string label = e.second;
            dest.insertEdge(l, r, label);
        }
    }
}